

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader.cc
# Opt level: O0

string * fizplex::MPSReader::next_word(istringstream *iss)

{
  istream *in_RSI;
  string *in_RDI;
  string *word;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::operator>>(in_RSI,(string *)in_RDI);
  return in_RDI;
}

Assistant:

std::string next_word(std::istringstream &iss) {
  std::string word;
  iss >> word;
  return word;
}